

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  _Optional_base<unsigned_int,_true,_true> _Var1;
  optional<unsigned_int> oVar2;
  Expression *this_00;
  bool bVar3;
  
  if (this->isConst == true) {
    if (this->isTrue == true) {
      this_00 = this->left_;
    }
    else {
      this_00 = this->right_;
    }
  }
  else {
    this_00 = (Expression *)0x0;
  }
  if (this_00 == (Expression *)0x0) {
    _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)
         Expression::getEffectiveWidth(this->left_);
    oVar2 = Expression::getEffectiveWidth(this->right_);
    if ((((ulong)_Var1._M_payload.super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) ||
       (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0)) {
      bVar3 = (bool)(oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_engaged &
                    ((ulong)_Var1._M_payload.super__Optional_payload_base<unsigned_int> >> 0x20 & 1)
                    == 0);
    }
    else {
      bVar3 = _Var1._M_payload.super__Optional_payload_base<unsigned_int>._M_payload <
              oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
    }
    if (bVar3 != false) {
      _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
           (_Optional_payload<unsigned_int,_true,_true,_true>)
           (_Optional_payload<unsigned_int,_true,_true,_true>)oVar2;
    }
  }
  else {
    _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)Expression::getEffectiveWidth(this_00);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    if (auto branch = knownSide())
        return branch->getEffectiveWidth();
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}